

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O0

bool __thiscall
duckdb::ColumnDataCollection::PrevScanIndex
          (ColumnDataCollection *this,ColumnDataScanState *state,idx_t *chunk_index,
          idx_t *segment_index,idx_t *row_index)

{
  pointer pCVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 *in_RCX;
  long *in_RDX;
  long in_RSI;
  size_type in_RDI;
  vector<duckdb::ChunkMetaData,_true> *in_R8;
  
  while( true ) {
    if (1 < *(ulong *)(in_RSI + 0x48)) {
      *(long *)(in_RSI + 0x48) = *(long *)(in_RSI + 0x48) + -1;
      *in_RCX = *(undefined8 *)(in_RSI + 0x40);
      *in_RDX = *(long *)(in_RSI + 0x48) + -1;
      *(undefined8 *)(in_RSI + 0x58) = *(undefined8 *)(in_RSI + 0x50);
      vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
                    *)in_R8,in_RDI);
      unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
      ::operator->((unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
                    *)in_R8);
      pvVar3 = vector<duckdb::ChunkMetaData,_true>::operator[](in_R8,in_RDI);
      *(ulong *)(in_RSI + 0x50) = *(long *)(in_RSI + 0x50) - (ulong)pvVar3->count;
      (in_R8->super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>).
      super__Vector_base<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(in_RSI + 0x50);
      return true;
    }
    if (*(long *)(in_RSI + 0x40) == 0) break;
    *(long *)(in_RSI + 0x40) = *(long *)(in_RSI + 0x40) + -1;
    vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
                  *)in_R8,in_RDI);
    pCVar1 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
             ::operator->((unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
                           *)in_R8);
    sVar2 = ::std::vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>::size
                      (&(pCVar1->chunk_data).
                        super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>)
    ;
    *(size_type *)(in_RSI + 0x48) = sVar2 + 1;
    ::std::
    unordered_map<unsigned_long,_duckdb::BufferHandle,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>_>
    ::clear((unordered_map<unsigned_long,_duckdb::BufferHandle,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>_>
             *)0x2b6ae9d);
  }
  return false;
}

Assistant:

bool ColumnDataCollection::PrevScanIndex(ColumnDataScanState &state, idx_t &chunk_index, idx_t &segment_index,
                                         idx_t &row_index) const {
	// check within the current segment if we still have chunks to scan
	// Note that state.chunk_index is 1-indexed, with 0 as undefined.
	while (state.chunk_index <= 1) {
		if (!state.segment_index) {
			return false;
		}

		--state.segment_index;
		state.chunk_index = segments[state.segment_index]->chunk_data.size() + 1;
		state.current_chunk_state.handles.clear();
	}

	--state.chunk_index;
	segment_index = state.segment_index;
	chunk_index = state.chunk_index - 1;
	state.next_row_index = state.current_row_index;
	state.current_row_index -= segments[state.segment_index]->chunk_data[chunk_index].count;
	row_index = state.current_row_index;
	return true;
}